

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghsymbol.cc
# Opt level: O3

void __thiscall VarnodeListSymbol::checkTableFill(VarnodeListSymbol *this)

{
  int iVar1;
  int extraout_var;
  undefined4 extraout_var_00;
  ulong uVar2;
  pointer ppVVar3;
  ulong uVar4;
  pointer ppVVar5;
  bool bVar6;
  
  (*(((this->super_ValueSymbol).patval)->super_PatternExpression)._vptr_PatternExpression[10])();
  iVar1 = (*(((this->super_ValueSymbol).patval)->super_PatternExpression)._vptr_PatternExpression
            [0xb])();
  if (extraout_var < 0) {
    ppVVar3 = (this->varnode_table).
              super__Vector_base<VarnodeSymbol_*,_std::allocator<VarnodeSymbol_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppVVar5 = (this->varnode_table).
              super__Vector_base<VarnodeSymbol_*,_std::allocator<VarnodeSymbol_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    uVar4 = (long)ppVVar5 - (long)ppVVar3 >> 3;
    bVar6 = false;
  }
  else {
    ppVVar3 = (this->varnode_table).
              super__Vector_base<VarnodeSymbol_*,_std::allocator<VarnodeSymbol_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppVVar5 = (this->varnode_table).
              super__Vector_base<VarnodeSymbol_*,_std::allocator<VarnodeSymbol_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    uVar4 = (long)ppVVar5 - (long)ppVVar3 >> 3;
    bVar6 = CONCAT44(extraout_var_00,iVar1) < uVar4;
  }
  this->tableisfilled = bVar6;
  if (ppVVar5 != ppVVar3) {
    uVar2 = 0;
    do {
      if (ppVVar3[uVar2] == (VarnodeSymbol *)0x0) {
        this->tableisfilled = false;
      }
      uVar2 = uVar2 + 1;
    } while ((uVar2 & 0xffffffff) < uVar4);
  }
  return;
}

Assistant:

void VarnodeListSymbol::checkTableFill(void)

{
  intb min = patval->minValue();
  intb max = patval->maxValue();
  tableisfilled = (min>=0)&&(max<varnode_table.size());
  for(uint4 i=0;i<varnode_table.size();++i) {
    if (varnode_table[i] == (VarnodeSymbol *)0)
      tableisfilled = false;
  }
}